

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-rcnb-cli.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0> *pcVar4;
  string *this;
  encoder E;
  locale utf8_locale;
  string choice;
  string output;
  string input;
  wofstream outstream;
  ifstream instream;
  encoder local_4b0;
  undefined1 local_4a8 [32];
  locale local_488;
  locale local_480;
  char *local_478;
  long local_470;
  char local_468 [16];
  char *local_458 [2];
  char local_448 [16];
  char *local_438 [2];
  char local_428 [16];
  undefined1 local_418 [16];
  _Impl local_408 [232];
  ios_base local_320 [264];
  string local_218 [16];
  
  if (argc == 4) {
    std::__cxx11::string::string((string *)local_438,argv[2],(allocator *)local_218);
    std::__cxx11::string::string((string *)local_458,argv[3],(allocator *)local_218);
    std::__cxx11::string::string((string *)&local_478,argv[1],(allocator *)local_218);
    iVar2 = std::__cxx11::string::compare((char *)&local_478);
    if (iVar2 == 0) {
      std::wifstream::wifstream(local_218,local_438[0],_S_in|_S_bin);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 == '\0') {
        local_418._0_8_ = local_408;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_418,"Could not open input file!","");
        usage((string *)local_418);
LAB_001039ea:
        this = (string *)local_418;
        goto LAB_00103a24;
      }
      std::locale::locale((locale *)local_418);
      pcVar4 = (codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0> *)operator_new(0x28);
      std::codecvt<wchar_t,char,__mbstate_t>::codecvt((ulong)pcVar4);
      *(undefined8 *)&pcVar4->field_0x18 = 0x10ffff;
      *(undefined4 *)&pcVar4->field_0x20 = 0;
      *(undefined ***)pcVar4 = &PTR____codecvt_utf8_base_00106d30;
      std::locale::locale<std::codecvt_utf8<wchar_t,1114111ul,(std::codecvt_mode)0>>
                ((locale *)&local_4b0,(locale *)local_418,pcVar4);
      std::locale::~locale((locale *)local_418);
      std::wios::imbue(&local_480);
      std::locale::~locale(&local_480);
      std::ofstream::ofstream(local_418,local_458[0],_S_out|_S_bin);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 != '\0') {
        local_4a8._24_4_ = 0x1000;
        rcnb::decoder::decode((decoder *)local_4a8,(wistream *)local_218,(ostream *)local_418);
        local_418._0_8_ = _VTT;
        *(undefined8 *)(local_418 + *(long *)(_VTT + -0x18)) = _memcpy;
        std::filebuf::~filebuf((filebuf *)(local_418 + 8));
        std::ios_base::~ios_base(local_320);
        std::locale::~locale((locale *)&local_4b0);
        std::wifstream::~wifstream(local_218);
        goto LAB_001038ba;
      }
      local_4a8._0_8_ = local_4a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4a8,"Could not open output file!","");
      usage((string *)local_4a8);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_478);
      if (iVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_478,local_470);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        local_218[0]._M_dataplus._M_p = (pointer)&local_218[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_218,"Please specify -d or -e as first argument!","");
        usage(local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218[0]._M_dataplus._M_p != &local_218[0].field_2) {
          operator_delete(local_218[0]._M_dataplus._M_p);
        }
LAB_001038ba:
        if (local_478 != local_468) {
          operator_delete(local_478);
        }
        if (local_458[0] != local_448) {
          operator_delete(local_458[0]);
        }
        if (local_438[0] != local_428) {
          operator_delete(local_438[0]);
        }
        return 0;
      }
      std::ifstream::ifstream(local_218,local_438[0],_S_in|_S_bin);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 == '\0') {
        local_418._0_8_ = local_408;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_418,"Could not open input file!","");
        usage((string *)local_418);
        goto LAB_001039ea;
      }
      std::wofstream::wofstream(local_418,local_458[0],_S_out|_S_bin);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 != '\0') {
        std::locale::locale((locale *)&local_4b0);
        pcVar4 = (codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0> *)operator_new(0x28);
        std::codecvt<wchar_t,char,__mbstate_t>::codecvt((ulong)pcVar4);
        *(undefined8 *)&pcVar4->field_0x18 = 0x10ffff;
        *(undefined4 *)&pcVar4->field_0x20 = 0;
        *(undefined ***)pcVar4 = &PTR____codecvt_utf8_base_00106d30;
        std::locale::locale<std::codecvt_utf8<wchar_t,1114111ul,(std::codecvt_mode)0>>
                  ((locale *)local_4a8,(locale *)&local_4b0,pcVar4);
        std::locale::~locale((locale *)&local_4b0);
        std::wios::imbue(&local_488);
        std::locale::~locale(&local_488);
        local_4b0._buffersize = 0x1000;
        rcnb::encoder::encode(&local_4b0,(istream *)local_218,(wostream *)local_418);
        std::locale::~locale((locale *)local_4a8);
        local_418._0_8_ = _VTT;
        *(undefined8 *)(local_418 + *(long *)(_VTT + -0x18)) = _locale;
        std::wfilebuf::~wfilebuf((wfilebuf *)(local_418 + 8));
        std::ios_base::~ios_base(local_320);
        std::ifstream::~ifstream(local_218);
        goto LAB_001038ba;
      }
      local_4a8._0_8_ = local_4a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4a8,"Could not open output file!","");
      usage((string *)local_4a8);
    }
    this = (string *)local_4a8;
  }
  else {
    if (argc == 1) {
      usage();
      goto LAB_00103a29;
    }
    local_218[0]._M_dataplus._M_p = (pointer)&local_218[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_218,"Wrong number of arguments!","");
    usage(local_218);
    this = local_218;
  }
LAB_00103a24:
  std::__cxx11::string::~string((string *)this);
LAB_00103a29:
  exit(-1);
}

Assistant:

int main(int argc, char** argv)
{
    if (argc == 1)
    {
        usage();
        exit(-1);
    }
    if (argc != 4)
    {
        usage("Wrong number of arguments!");
        exit(-1);
    }

    std::string input = argv[2];
    std::string output = argv[3];

    // determine whether we need to encode or decode:
    std::string choice = argv[1];
    if (choice == "-d")
    {
        std::wifstream instream(input.c_str(), std::ios_base::in | std::ios_base::binary);
        if (!instream.is_open())
        {
            usage("Could not open input file!");
            exit(-1);
        }
        std::locale utf8_locale(std::locale(), new std::codecvt_utf8<wchar_t>);
        instream.imbue(utf8_locale);

        std::ofstream outstream(output.c_str(), std::ios_base::out | std::ios_base::binary);
        if (!outstream.is_open())
        {
            usage("Could not open output file!");
            exit(-1);
        }
        rcnb::decoder D;
        D.decode(instream, outstream);
    }
    else if (choice == "-e")
    {
        std::ifstream instream(input.c_str(), std::ios_base::in | std::ios_base::binary);
        if (!instream.is_open())
        {
            usage("Could not open input file!");
            exit(-1);
        }

        std::wofstream outstream(output.c_str(), std::ios_base::out | std::ios_base::binary);
        if (!outstream.is_open())
        {
            usage("Could not open output file!");
            exit(-1);
        }
        std::locale utf8_locale(std::locale(), new std::codecvt_utf8<wchar_t>);
        outstream.imbue(utf8_locale);
        rcnb::encoder E;
        E.encode(instream, outstream);
    }
    else
    {
        std::cout<<"["<<choice<<"]"<<std::endl;
        usage("Please specify -d or -e as first argument!");
    }

    return 0;
}